

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spmd.h
# Opt level: O2

time_t __thiscall bsplib::Spmd::time(Spmd *this,time_t *__timer)

{
  timespec now;
  
  clock_gettime(1,(timespec *)&now);
  return now.tv_sec - (this->m_time).tv_sec;
}

Assistant:

double time() const { 
      struct timespec now;
      clock_gettime( CLOCK_MONOTONIC, &now );
      return (now.tv_sec - m_time.tv_sec) 
               + 1e-9 * (now.tv_nsec - m_time.tv_nsec );
    }